

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall leveldb::Arena::~Arena(Arena *this)

{
  long lVar1;
  pointer ppcVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppcVar2 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar2) {
    uVar3 = 0;
    do {
      if (ppcVar2[uVar3] != (char *)0x0) {
        operator_delete__(ppcVar2[uVar3]);
      }
      uVar3 = uVar3 + 1;
      ppcVar2 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->blocks_).
                                   super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3));
  }
  if (ppcVar2 == (pointer)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(ppcVar2,(long)(this->blocks_).
                                  super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppcVar2);
    return;
  }
  __stack_chk_fail();
}

Assistant:

Arena::~Arena() {
  for (size_t i = 0; i < blocks_.size(); i++) {
    delete[] blocks_[i];
  }
}